

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::remove_temporary_slot(Am_Object_Data *this,Am_Slot_Key key)

{
  am_CList *this_00;
  Am_Slot local_30;
  Am_Slot_Data *local_28;
  Am_Slot_Data *slot;
  Am_Slot_Data **slot_array;
  uint i;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  slot_array._0_4_ = 0;
  slot = (Am_Slot_Data *)(this->data).data;
  slot_array._6_2_ = key;
  _i = this;
  do {
    if ((this->data).length <= (uint)slot_array) {
      remove_temporaries(this,slot_array._6_2_);
      return;
    }
    local_28 = *(Am_Slot_Data **)&slot->super_Am_Value;
    if (slot_array._6_2_ == local_28->key) {
      if ((*(ushort *)&local_28->field_0x38 & 2) == 0) {
        return;
      }
      DynArray::Delete(&this->data,(uint)slot_array);
      this_00 = &local_28->dependencies;
      Am_Slot::Am_Slot(&local_30,local_28);
      am_CList::Invalidate(this_00,&local_30,(Am_Constraint *)0x0,&local_28->super_Am_Value);
      Am_Slot_Data::Destroy(local_28);
    }
    slot_array._0_4_ = (uint)slot_array + 1;
    slot = (Am_Slot_Data *)&(slot->super_Am_Value).value;
  } while( true );
}

Assistant:

void
Am_Object_Data::remove_temporary_slot(Am_Slot_Key key)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = 0, slot_array = (Am_Slot_Data **)data.data; i < data.length;
       ++i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        data.Delete(i);
        slot->dependencies.Invalidate(slot, nullptr, *slot);
        slot->Destroy();
      } else
        return;
    }
  }
  remove_temporaries(key);
}